

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

bool __thiscall
crnlib::mipmapped_texture::flip_y(mipmapped_texture *this,bool update_orientation_flags)

{
  orientation_flags_t *poVar1;
  vector<crnlib::mip_level_*> *pvVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  mipmapped_texture temp_tex;
  mipmapped_texture mStack_68;
  
  mipmapped_texture(&mStack_68,this);
  bVar3 = flip_y_helper(&mStack_68);
  if (!bVar3) {
    operator=(&mStack_68,this);
    unpack_from_dxt(&mStack_68,false);
    bVar3 = flip_y_helper(&mStack_68);
    if (!bVar3) {
      bVar3 = false;
      goto LAB_00141a9c;
    }
  }
  swap(this,&mStack_68);
  bVar3 = true;
  if ((update_orientation_flags) && ((this->m_faces).m_size != 0)) {
    uVar4 = 0;
    do {
      pvVar2 = (this->m_faces).m_p;
      if (pvVar2[uVar4].m_size != 0) {
        uVar5 = 0;
        do {
          poVar1 = &pvVar2[uVar4].m_p[uVar5]->m_orient_flags;
          *poVar1 = *poVar1 ^ cOrientationFlagYFlipped;
          uVar5 = uVar5 + 1;
          pvVar2 = (this->m_faces).m_p;
        } while (uVar5 < pvVar2[uVar4].m_size);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (this->m_faces).m_size);
  }
LAB_00141a9c:
  ~mipmapped_texture(&mStack_68);
  return bVar3;
}

Assistant:

bool mipmapped_texture::flip_y(bool update_orientation_flags) {
  mipmapped_texture temp_tex(*this);
  if (!temp_tex.flip_y_helper()) {
    temp_tex = *this;
    temp_tex.unpack_from_dxt(true);
    if (!temp_tex.flip_y_helper())
      return false;
  }
  swap(temp_tex);

  if (update_orientation_flags) {
    for (uint f = 0; f < get_num_faces(); f++) {
      for (uint m = 0; m < get_face(f).size(); m++) {
        uint orient_flags = get_face(f)[m]->get_orientation_flags();
        orient_flags ^= cOrientationFlagYFlipped;
        get_face(f)[m]->set_orientation_flags(static_cast<orientation_flags_t>(orient_flags));
      }
    }
  }

  CRNLIB_ASSERT(check());

  return true;
}